

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

char * ToStringHelper(uint *a,uint count,char *dst_str,char *dst_str_end)

{
  char *pcVar1;
  uint local_34;
  uint local_2c;
  uint imax;
  uint i;
  char *dst_str_end_local;
  char *dst_str_local;
  uint count_local;
  uint *a_local;
  
  pcVar1 = ToStringHelper("[",dst_str,dst_str_end);
  pcVar1 = ToStringHelper(count,pcVar1,dst_str_end);
  pcVar1 = ToStringHelper("]=",pcVar1,dst_str_end);
  if (a == (uint *)0x0) {
    dst_str_end_local = ToStringHelper("null",pcVar1,dst_str_end);
  }
  else {
    dst_str_end_local = ToStringHelper("(",pcVar1,dst_str_end);
    if (count == 0xffffffff) {
      dst_str_end_local = ToStringHelper("?",dst_str_end_local,dst_str_end);
    }
    else {
      local_34 = count;
      if (7 < count) {
        local_34 = 4;
      }
      for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
        if (local_2c != 0) {
          dst_str_end_local = ToStringHelper(",",dst_str_end_local,dst_str_end);
        }
        dst_str_end_local = ToStringHelper(a[local_2c],dst_str_end_local,dst_str_end);
      }
      if (local_2c < count) {
        pcVar1 = ToStringHelper(",...,",dst_str_end_local,dst_str_end);
        dst_str_end_local = ToStringHelper(a[count - 1],pcVar1,dst_str_end);
      }
    }
    dst_str_end_local = ToStringHelper(")",dst_str_end_local,dst_str_end);
  }
  return dst_str_end_local;
}

Assistant:

static char* ToStringHelper( const unsigned int* a, unsigned int count, char* dst_str, const char* dst_str_end )
{
  unsigned int i, imax;

  dst_str = ToStringHelper("[",dst_str,dst_str_end);
  dst_str = ToStringHelper(count,dst_str,dst_str_end);
  dst_str = ToStringHelper("]=",dst_str,dst_str_end);
  if ( 0 == a )
    dst_str = ToStringHelper("null",dst_str,dst_str_end);
  else
  {
    dst_str = ToStringHelper("(",dst_str,dst_str_end);
    if ( ON_UNSET_UINT_INDEX == count )
    {
      dst_str = ToStringHelper("?",dst_str,dst_str_end);
    }
    else
    {
      imax = (count <= 7 ? count : 4 );
      for ( i = 0; i < imax; i++ )
      {
        if ( i )
          dst_str = ToStringHelper(",",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[i],dst_str,dst_str_end);
      }
      if ( i < count )
      {
        dst_str = ToStringHelper(",...,",dst_str,dst_str_end);
        dst_str = ToStringHelper(a[count-1],dst_str,dst_str_end);
      }
    }
    dst_str = ToStringHelper(")",dst_str,dst_str_end);
  }

  return dst_str;
}